

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void print_states(Grammar *g)

{
  State *pSVar1;
  Elem *pEVar2;
  Elem *ee;
  Action *pAVar3;
  bool bVar4;
  Rule *pRVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  uint local_44;
  Grammar *local_40;
  ulong local_38;
  
  if ((g->states).n != 0) {
    local_38 = 0;
    local_40 = g;
    do {
      pSVar1 = (local_40->states).v[local_38];
      local_44 = 0;
      pcVar6 = " ACCEPT";
      if ((pSVar1->field_0x178 & 1) == 0) {
        pcVar6 = "";
      }
      printf("STATE %d (%d ITEMS)%s\n",(ulong)pSVar1->index,(ulong)(pSVar1->items).n,pcVar6);
      if ((pSVar1->items).n != 0) {
        uVar7 = 0;
        do {
          pEVar2 = (pSVar1->items).v[uVar7];
          printf("\t%s: ",pEVar2->rule->prod->name);
          pRVar5 = pEVar2->rule;
          if ((pRVar5->elems).n == 0) {
LAB_0013abef:
            printf(". ");
          }
          else {
            bVar4 = true;
            uVar8 = 0;
            do {
              ee = (pRVar5->elems).v[uVar8];
              if (ee == pEVar2) {
                bVar4 = false;
                printf(". ");
              }
              print_elem(ee);
              uVar8 = uVar8 + 1;
              pRVar5 = pEVar2->rule;
            } while (uVar8 < (pRVar5->elems).n);
            if (bVar4) goto LAB_0013abef;
          }
          putchar(10);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (pSVar1->items).n);
      }
      if ((pSVar1->gotos).n != 0) {
        puts("  GOTO");
      }
      if ((pSVar1->gotos).n != 0) {
        uVar7 = 0;
        do {
          putchar(9);
          print_elem((pSVar1->gotos).v[uVar7]->elem);
          printf(" : %d\n",(ulong)(pSVar1->gotos).v[uVar7]->state->index);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (pSVar1->gotos).n);
      }
      puts("  ACTION");
      if ((pSVar1->reduce_actions).n != 0) {
        uVar7 = 0;
        do {
          pAVar3 = (pSVar1->reduce_actions).v[uVar7];
          printf("\t%s\t",action_types[pAVar3->kind]);
          print_rule(pAVar3->rule);
          putchar(10);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (pSVar1->reduce_actions).n);
      }
      if ((pSVar1->shift_actions).n != 0) {
        uVar7 = 0;
        do {
          pAVar3 = (pSVar1->shift_actions).v[uVar7];
          printf("\t%s\t",action_types[pAVar3->kind]);
          if (pAVar3->kind == ACTION_SHIFT) {
            print_term(pAVar3->term);
            printf("%d",(ulong)pAVar3->state->index);
          }
          putchar(10);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (pSVar1->shift_actions).n);
      }
      if (1 < (pSVar1->reduce_actions).n) {
        print_conflict("reduce/reduce",&local_44);
      }
      if (((pSVar1->reduce_actions).n != 0) && ((pSVar1->shift_actions).n != 0)) {
        print_conflict("shift/reduce",&local_44);
      }
      putchar(10);
      local_38 = local_38 + 1;
    } while (local_38 < (local_40->states).n);
  }
  return;
}

Assistant:

void print_states(Grammar *g) {
  uint i;

  for (i = 0; i < g->states.n; i++) print_state(g->states.v[i]);
}